

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg.c
# Opt level: O2

void aom_highbd_hadamard_32x32_c(int16_t *src_diff,ptrdiff_t src_stride,tran_low_t *coeff)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  tran_low_t *coeff_00;
  long lVar6;
  
  uVar3 = 0;
  coeff_00 = coeff;
  for (lVar6 = 0; lVar6 != 0x20; lVar6 = lVar6 + 8) {
    aom_highbd_hadamard_16x16_c
              (src_diff + (ulong)((uint)lVar6 & 0x10) * src_stride + (ulong)(uVar3 & 0x10),
               src_stride,coeff_00);
    coeff_00 = coeff_00 + 0x100;
    uVar3 = uVar3 + 0x10;
  }
  for (lVar6 = 0; (int)lVar6 != 0x100; lVar6 = lVar6 + 1) {
    iVar5 = coeff[lVar6 + 0x100] + coeff[lVar6] >> 2;
    iVar1 = coeff[lVar6] - coeff[lVar6 + 0x100] >> 2;
    iVar4 = coeff[lVar6 + 0x300] + coeff[lVar6 + 0x200] >> 2;
    iVar2 = coeff[lVar6 + 0x200] - coeff[lVar6 + 0x300] >> 2;
    coeff[lVar6] = iVar4 + iVar5;
    coeff[lVar6 + 0x100] = iVar2 + iVar1;
    coeff[lVar6 + 0x200] = iVar5 - iVar4;
    coeff[lVar6 + 0x300] = iVar1 - iVar2;
  }
  return;
}

Assistant:

void aom_highbd_hadamard_32x32_c(const int16_t *src_diff, ptrdiff_t src_stride,
                                 tran_low_t *coeff) {
  int idx;
  for (idx = 0; idx < 4; ++idx) {
    // src_diff: 13 bit, dynamic range [-4095, 4095]
    const int16_t *src_ptr =
        src_diff + (idx >> 1) * 16 * src_stride + (idx & 0x01) * 16;
    aom_highbd_hadamard_16x16_c(src_ptr, src_stride, coeff + idx * 256);
  }

  // coeff: 20 bit
  for (idx = 0; idx < 256; ++idx) {
    tran_low_t a0 = coeff[0];
    tran_low_t a1 = coeff[256];
    tran_low_t a2 = coeff[512];
    tran_low_t a3 = coeff[768];

    tran_low_t b0 = (a0 + a1) >> 2;
    tran_low_t b1 = (a0 - a1) >> 2;
    tran_low_t b2 = (a2 + a3) >> 2;
    tran_low_t b3 = (a2 - a3) >> 2;

    // new coeff dynamic range: 20 bit
    coeff[0] = b0 + b2;
    coeff[256] = b1 + b3;
    coeff[512] = b0 - b2;
    coeff[768] = b1 - b3;

    ++coeff;
  }
}